

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdEmuD3D56TlvZ::is_valid_val(MthdEmuD3D56TlvZ *this)

{
  int e;
  MthdEmuD3D56TlvZ *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) < 0) {
      return false;
    }
    if (0x7e < (byte)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x38)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_valid_val() override {
		if (cls == 0x48) {
			if (extr(val, 31, 1))
				return false;
			int e = extr(val, 23, 8);
			if (e >= 0x7f)
				return false;
		}
		return true;
	}